

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Error externalEntityInitProcessor3(XML_Parser parser,char *start,char *end,char **endPtr)

{
  int iVar1;
  XML_Error XVar2;
  char *in_RAX;
  char *next;
  
  iVar1 = (**(code **)(*(long *)((long)parser + 0x118) + 8))();
  if (iVar1 == -2) {
    if (endPtr == (char **)0x0) {
      *(char **)((long)parser + 0x218) = start;
      return XML_ERROR_PARTIAL_CHAR;
    }
  }
  else {
    if (iVar1 != -1) {
      if ((iVar1 == 0xc) &&
         (XVar2 = processXmlDecl(parser,1,start,in_RAX), start = in_RAX, XVar2 != XML_ERROR_NONE)) {
        return XVar2;
      }
      *(code **)((long)parser + 0x208) = externalEntityContentProcessor;
      *(undefined4 *)((long)parser + 0x23c) = 1;
      XVar2 = doContent(parser,1,*(ENCODING **)((long)parser + 0x118),start,end,endPtr);
      return XVar2;
    }
    if (endPtr == (char **)0x0) {
      *(char **)((long)parser + 0x218) = start;
      return XML_ERROR_UNCLOSED_TOKEN;
    }
  }
  *endPtr = start;
  return XML_ERROR_NONE;
}

Assistant:

static
enum XML_Error externalEntityInitProcessor3(XML_Parser parser,
                                            const char *start,
                                            const char *end,
                                            const char **endPtr)
{
  const char *next;
  int tok = XmlContentTok(encoding, start, end, &next);
  switch (tok) {
  case XML_TOK_XML_DECL:
    {
      enum XML_Error result = processXmlDecl(parser, 1, start, next);
      if (result != XML_ERROR_NONE)
        return result;
      start = next;
    }
    break;
  case XML_TOK_PARTIAL:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_UNCLOSED_TOKEN;
  case XML_TOK_PARTIAL_CHAR:
    if (endPtr) {
      *endPtr = start;
      return XML_ERROR_NONE;
    }
    eventPtr = start;
    return XML_ERROR_PARTIAL_CHAR;
  }
  processor = externalEntityContentProcessor;
  tagLevel = 1;
  return doContent(parser, 1, encoding, start, end, endPtr);
}